

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O1

CURLcode cf_tcp_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  int error;
  uint uVar1;
  void *pvVar2;
  curl_trc_feat *pcVar3;
  _Bool _Var4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  char *pcVar9;
  CURLcode CVar10;
  curltime cVar11;
  char buffer [256];
  char local_138 [264];
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  if (blocking) {
    return CURLE_UNSUPPORTED_PROTOCOL;
  }
  pvVar2 = cf->ctx;
  *done = false;
  CVar10 = CURLE_COULDNT_CONNECT;
  if (*(int *)((long)pvVar2 + 0x98) == -1) {
    CVar10 = cf_socket_open(cf,data);
    iVar6 = 2;
    if (CVar10 == CURLE_OK) {
      if ((cf->field_0x24 & 1) == 0) {
        iVar7 = do_connect(cf,data,(_Bool)((byte)(*(uint *)&cf->conn->bits >> 0x17) & 1));
        piVar8 = __errno_location();
        error = *piVar8;
        set_local_ip(cf,data);
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
          pcVar3 = (data->state).feat;
          if (pcVar3 == (curl_trc_feat *)0x0) {
            if (cf != (Curl_cfilter *)0x0) goto LAB_00115f59;
          }
          else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar3->log_level)) {
LAB_00115f59:
            if (0 < cf->cft->log_level) {
              Curl_trc_cf_infof(data,cf,"local address %s port %d...",(long)pvVar2 + 0xca,
                                (ulong)*(uint *)((long)pvVar2 + 0xfc));
            }
          }
        }
        iVar6 = 0;
        CVar10 = CURLE_OK;
        if (iVar7 == -1) {
          CVar10 = socket_connect_result(data,(char *)((long)pvVar2 + 0x9c),error);
          iVar6 = 2;
        }
      }
      else {
        *done = true;
        CVar10 = CURLE_OK;
        iVar6 = 1;
      }
    }
    if (iVar6 != 2) {
      if (iVar6 != 0) {
        return CURLE_OK;
      }
      goto LAB_00115d38;
    }
LAB_00115fc0:
    if (CVar10 != CURLE_OK) {
      if (*(int *)((long)pvVar2 + 0x130) != 0) {
        set_local_ip(cf,data);
        iVar6 = *(int *)((long)pvVar2 + 0x130);
        (data->state).os_errno = iVar6;
        piVar8 = __errno_location();
        *piVar8 = iVar6;
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))
           )) {
          uVar5 = *(uint *)((long)pvVar2 + 0xf8);
          uVar1 = *(uint *)((long)pvVar2 + 0xfc);
          pcVar9 = Curl_strerror(*(int *)((long)pvVar2 + 0x130),local_138,0x100);
          Curl_infof(data,"connect to %s port %u from %s port %d failed: %s",(long)pvVar2 + 0x9c,
                     (ulong)uVar5,(long)pvVar2 + 0xca,(ulong)uVar1,pcVar9);
        }
      }
      if (*(int *)((long)pvVar2 + 0x98) != -1) {
        socket_close(data,cf->conn,1,*(int *)((long)pvVar2 + 0x98));
        *(undefined4 *)((long)pvVar2 + 0x98) = 0xffffffff;
      }
      *done = false;
    }
  }
  else {
LAB_00115d38:
    uVar5 = Curl_socket_check(-1,-1,*(curl_socket_t *)((long)pvVar2 + 0x98),0);
    if (uVar5 == 2) {
LAB_00115e78:
      _Var4 = verifyconnect(*(curl_socket_t *)((long)pvVar2 + 0x98),(int *)((long)pvVar2 + 0x130));
      if (!_Var4) goto LAB_00115fc0;
      cVar11 = Curl_now();
      *(time_t *)((long)pvVar2 + 0x110) = cVar11.tv_sec;
      *(int *)((long)pvVar2 + 0x118) = cVar11.tv_usec;
      set_local_ip(cf,data);
      *done = true;
      cf->field_0x24 = cf->field_0x24 | 1;
      if (data == (Curl_easy *)0x0) {
        return CURLE_OK;
      }
      if (((data->set).field_0x8cd & 0x10) == 0) {
        return CURLE_OK;
      }
      pcVar3 = (data->state).feat;
      if (pcVar3 == (curl_trc_feat *)0x0) {
        if (cf == (Curl_cfilter *)0x0) {
          return CURLE_OK;
        }
      }
      else {
        if (cf == (Curl_cfilter *)0x0) {
          return CURLE_OK;
        }
        if (pcVar3->log_level < 1) {
          return CURLE_OK;
        }
      }
      if (cf->cft->log_level < 1) {
        return CURLE_OK;
      }
      pcVar9 = "connected";
    }
    else {
      if (uVar5 != 0) {
        if (((cf->conn->bits).field_0x2 & 0x80) == 0) {
          if ((uVar5 & 4) != 0) {
            verifyconnect(*(curl_socket_t *)((long)pvVar2 + 0x98),(int *)((long)pvVar2 + 0x130));
            CVar10 = CURLE_COULDNT_CONNECT;
          }
          goto LAB_00115fc0;
        }
        goto LAB_00115e78;
      }
      if (data == (Curl_easy *)0x0) {
        return CURLE_OK;
      }
      if (((data->set).field_0x8cd & 0x10) == 0) {
        return CURLE_OK;
      }
      pcVar3 = (data->state).feat;
      if (pcVar3 == (curl_trc_feat *)0x0) {
        if (cf == (Curl_cfilter *)0x0) {
          return CURLE_OK;
        }
      }
      else {
        if (cf == (Curl_cfilter *)0x0) {
          return CURLE_OK;
        }
        if (pcVar3->log_level < 1) {
          return CURLE_OK;
        }
      }
      if (cf->cft->log_level < 1) {
        return CURLE_OK;
      }
      pcVar9 = "not connected yet";
    }
    CVar10 = CURLE_OK;
    Curl_trc_cf_infof(data,cf,pcVar9);
  }
  return CVar10;
}

Assistant:

static CURLcode cf_tcp_connect(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               bool blocking, bool *done)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_COULDNT_CONNECT;
  int rc = 0;

  (void)data;
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* TODO: need to support blocking connect? */
  if(blocking)
    return CURLE_UNSUPPORTED_PROTOCOL;

  *done = FALSE; /* a very negative world view is best */
  if(ctx->sock == CURL_SOCKET_BAD) {
    int error;

    result = cf_socket_open(cf, data);
    if(result)
      goto out;

    if(cf->connected) {
      *done = TRUE;
      return CURLE_OK;
    }

    /* Connect TCP socket */
    rc = do_connect(cf, data, cf->conn->bits.tcp_fastopen);
    error = SOCKERRNO;
    set_local_ip(cf, data);
    CURL_TRC_CF(data, cf, "local address %s port %d...",
                ctx->ip.local_ip, ctx->ip.local_port);
    if(-1 == rc) {
      result = socket_connect_result(data, ctx->ip.remote_ip, error);
      goto out;
    }
  }

#ifdef mpeix
  /* Call this function once now, and ignore the results. We do this to
     "clear" the error state on the socket so that we can later read it
     reliably. This is reported necessary on the MPE/iX operating
     system. */
  (void)verifyconnect(ctx->sock, NULL);
#endif
  /* check socket for connect */
  rc = SOCKET_WRITABLE(ctx->sock, 0);

  if(rc == 0) { /* no connection yet */
    CURL_TRC_CF(data, cf, "not connected yet");
    return CURLE_OK;
  }
  else if(rc == CURL_CSELECT_OUT || cf->conn->bits.tcp_fastopen) {
    if(verifyconnect(ctx->sock, &ctx->error)) {
      /* we are connected with TCP, awesome! */
      ctx->connected_at = Curl_now();
      set_local_ip(cf, data);
      *done = TRUE;
      cf->connected = TRUE;
      CURL_TRC_CF(data, cf, "connected");
      return CURLE_OK;
    }
  }
  else if(rc & CURL_CSELECT_ERR) {
    (void)verifyconnect(ctx->sock, &ctx->error);
    result = CURLE_COULDNT_CONNECT;
  }

out:
  if(result) {
    if(ctx->error) {
      set_local_ip(cf, data);
      data->state.os_errno = ctx->error;
      SET_SOCKERRNO(ctx->error);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      {
        char buffer[STRERROR_LEN];
        infof(data, "connect to %s port %u from %s port %d failed: %s",
              ctx->ip.remote_ip, ctx->ip.remote_port,
              ctx->ip.local_ip, ctx->ip.local_port,
              Curl_strerror(ctx->error, buffer, sizeof(buffer)));
      }
#endif
    }
    if(ctx->sock != CURL_SOCKET_BAD) {
      socket_close(data, cf->conn, TRUE, ctx->sock);
      ctx->sock = CURL_SOCKET_BAD;
    }
    *done = FALSE;
  }
  return result;
}